

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig> *this)

{
  TestConfig_conflict TVar1;
  TestStatus *pTVar2;
  Context *pCVar3;
  TestConfig *this_00;
  Function p_Var4;
  undefined1 in_stack_ffffffffffffff80 [48];
  FunctionInstance1<vkt::memory::(anonymous_namespace)::TestConfig> *this_local;
  
  pCVar3 = (this->super_TestInstance).m_context;
  p_Var4 = (this->m_args).func;
  this_00 = (TestConfig *)&stack0xffffffffffffff90;
  pTVar2 = __return_storage_ptr__;
  vkt::memory::anon_unknown_0::TestConfig::TestConfig(this_00,&(this->m_args).arg0);
  TVar1._8_8_ = pTVar2;
  TVar1.allocationSize = (VkDeviceSize)__return_storage_ptr__;
  TVar1.mapping.offset = (VkDeviceSize)pCVar3;
  TVar1.mapping.size = (VkDeviceSize)this_00;
  TVar1.flushMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var4;
  TVar1.flushMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff80._0_8_;
  TVar1.flushMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffff80._8_8_;
  TVar1.invalidateMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
        )(_Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
          )in_stack_ffffffffffffff80._16_24_;
  TVar1.remap = (bool)in_stack_ffffffffffffff80[0x28];
  TVar1._81_7_ = in_stack_ffffffffffffff80._41_7_;
  (*p_Var4)(pTVar2,pCVar3,TVar1);
  vkt::memory::anon_unknown_0::TestConfig::~TestConfig((TestConfig *)&stack0xffffffffffffff90);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }